

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall asl::String::trim(String *this)

{
  bool bVar1;
  char *__dest;
  char *s;
  int local_18;
  int n;
  int j;
  int i;
  String *this_local;
  
  local_18 = this->_len;
  __dest = str(this);
  n = 0;
  while ((n < local_18 && (bVar1 = myisspace(__dest[n]), bVar1))) {
    n = n + 1;
  }
  do {
    local_18 = local_18 + -1;
    if (local_18 < n) break;
    bVar1 = myisspace(__dest[local_18]);
  } while (bVar1);
  memmove(__dest,__dest + n,(long)((local_18 - n) + 1));
  __dest[(local_18 - n) + 1] = '\0';
  this->_len = (local_18 - n) + 1;
  return this;
}

Assistant:

String& String::trim()
{
	int i, j, n = _len;
	char* s = str();
	for (i = 0; i<n; i++)
		if (!myisspace(s[i])) break;
	for (j = n - 1; j >= i; j--)
		if (!myisspace(s[j])) break;
	memmove(s, s + i, j - i + 1);
	s[j - i + 1] = '\0';
	_len = j - i + 1;
	return *this;
}